

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> * __thiscall
cnn::Tensor::operator*
          (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>
           *__return_storage_ptr__,Tensor *this)

{
  uint uVar1;
  ulong cols;
  char *__assertion;
  
  if ((this->d).bd == 1) {
    uVar1 = (this->d).nd;
    if (uVar1 < 3) {
      cols = 1;
      if (uVar1 == 2) {
        cols = (ulong)(this->d).d[1];
      }
      Eigen::
      MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
      MapBase((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               *)__return_storage_ptr__,this->v,(ulong)(this->d).d[0],cols);
      return __return_storage_ptr__;
    }
    __assertion = "d.ndims() < 3";
    uVar1 = 0x29;
  }
  else {
    __assertion = "d.batch_elems() == 1";
    uVar1 = 0x28;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.h"
                ,uVar1,"Eigen::Map<Eigen::MatrixXf> cnn::Tensor::operator*()");
}

Assistant:

Eigen::Map<Eigen::MatrixXf> operator*() {
    assert(d.batch_elems() == 1);
    assert(d.ndims() < 3);
    return Eigen::Map<Eigen::MatrixXf>(v, d.rows(), d.cols());
  }